

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O0

bool __thiscall StreamSummary<4U>::Add_Data(StreamSummary<4U> *this,Data<4U> *data)

{
  mapped_type pSVar1;
  StreamBucket *pSVar2;
  bool bVar3;
  mapped_type *ppSVar4;
  StreamCounter *in_RDI;
  StreamSummary<4U> *unaff_retaddr;
  StreamBucket *prev;
  StreamCounter *temp;
  bool del;
  unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
  *in_stack_ffffffffffffffa8;
  unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
  *in_stack_ffffffffffffffb0;
  _Node_iterator_base<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_true> local_28;
  _Node_iterator_base<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_true>
  local_20 [2];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
       ::find(in_stack_ffffffffffffffa8,(key_type *)0x115266);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
       ::end(in_stack_ffffffffffffffa8);
  bVar3 = std::__detail::operator==(local_20,&local_28);
  if (bVar3) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    ppSVar4 = std::
              unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
              ::operator[](in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
    pSVar1 = *ppSVar4;
    pSVar2 = pSVar1->parent;
    Node<Data<4U>_>::Delete((Node<Data<4U>_> *)0x1152d5);
    if (pSVar2->child == pSVar1) {
      pSVar2->child = (StreamCounter *)(pSVar1->super_Node<Data<4U>_>).next;
      bVar3 = (pSVar1->super_Node<Data<4U>_>).next == (Node<Data<4U>_> *)0x0;
    }
    Add_Bucket(unaff_retaddr,
               (StreamBucket *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI)
    ;
    if ((bVar3) && (Node<int>::Delete((Node<int> *)0x115333), pSVar2 != (StreamBucket *)0x0)) {
      operator_delete(pSVar2,0x20);
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Add_Data(const Data<DATA_LEN>& data) {
		if (mp.find(data) == mp.end()) return false;

		bool del = false;
		StreamCounter* temp = mp[data];
		StreamBucket* prev = temp->parent;
		temp->Delete();
		if (prev->child == temp) {
			prev->child = (StreamCounter*)temp->next;
			if (temp->next == NULL) del = true;
		}

		Add_Bucket(temp->parent, temp);

		if (del) {
			prev->Delete();
			delete prev;
		}

		return true;
	}